

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_interpolate_edge
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL node0_weight;
  REF_INT i;
  REF_DBL log_m [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  REF_INT new_node_local;
  REF_DBL node1_weight_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_NODE ref_node_local;
  
  if ((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->global[node0] < 0)) ||
     (((node1 < 0 || (ref_node->max <= node1)) || (ref_node->global[node1] < 0)))) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa3e,
           "ref_node_interpolate_edge",3,"node invalid");
    ref_node_local._4_4_ = 3;
  }
  else {
    for (node0_weight._4_4_ = 0; node0_weight._4_4_ < 3; node0_weight._4_4_ = node0_weight._4_4_ + 1
        ) {
      ref_node->real[node0_weight._4_4_ + new_node * 0xf] =
           (1.0 - node1_weight) * ref_node->real[node0_weight._4_4_ + node0 * 0xf] +
           node1_weight * ref_node->real[node0_weight._4_4_ + node1 * 0xf];
    }
    for (node0_weight._4_4_ = 0; node0_weight._4_4_ < ref_node->naux;
        node0_weight._4_4_ = node0_weight._4_4_ + 1) {
      ref_node->aux[node0_weight._4_4_ + ref_node->naux * new_node] =
           (1.0 - node1_weight) * ref_node->aux[node0_weight._4_4_ + ref_node->naux * node0] +
           node1_weight * ref_node->aux[node0_weight._4_4_ + ref_node->naux * node1];
    }
    ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,node0,log_m1 + 5);
    if (ref_node_local._4_4_ == 0) {
      ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,node1,log_m + 5);
      if (ref_node_local._4_4_ == 0) {
        ref_node_local._4_4_ =
             ref_matrix_weight_m(log_m1 + 5,log_m + 5,node1_weight,
                                 (REF_DBL *)&stack0xffffffffffffff38);
        if (ref_node_local._4_4_ == 0) {
          ref_node_local._4_4_ =
               ref_node_metric_set_log(ref_node,new_node,(REF_DBL *)&stack0xffffffffffffff38);
          if (ref_node_local._4_4_ == 0) {
            ref_node_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0xa4f,"ref_node_interpolate_edge",(ulong)ref_node_local._4_4_,"log new");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xa4d,"ref_node_interpolate_edge",(ulong)ref_node_local._4_4_,"log weight");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xa4b,"ref_node_interpolate_edge",(ulong)ref_node_local._4_4_,"log 1");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa4a,
             "ref_node_interpolate_edge",(ulong)ref_node_local._4_4_,"log 0");
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_interpolate_edge(REF_NODE ref_node, REF_INT node0,
                                             REF_INT node1,
                                             REF_DBL node1_weight,
                                             REF_INT new_node) {
  REF_DBL log_m0[6], log_m1[6], log_m[6];
  REF_INT i;
  REF_DBL node0_weight = 1.0 - node1_weight;

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  for (i = 0; i < 3; i++)
    ref_node_xyz(ref_node, i, new_node) =
        node0_weight * ref_node_xyz(ref_node, i, node0) +
        node1_weight * ref_node_xyz(ref_node, i, node1);

  for (i = 0; i < ref_node_naux(ref_node); i++)
    ref_node_aux(ref_node, i, new_node) =
        node0_weight * ref_node_aux(ref_node, i, node0) +
        node1_weight * ref_node_aux(ref_node, i, node1);

  RSS(ref_node_metric_get_log(ref_node, node0, log_m0), "log 0");
  RSS(ref_node_metric_get_log(ref_node, node1, log_m1), "log 1");

  RSS(ref_matrix_weight_m(log_m0, log_m1, node1_weight, log_m), "log weight");

  RSS(ref_node_metric_set_log(ref_node, new_node, log_m), "log new");

  return REF_SUCCESS;
}